

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_invocable.h
# Opt level: O0

void __thiscall
absl::lts_20250127::internal_any_invocable::
CoreImpl<false,void,std::basic_string_view<char,std::char_traits<char>>,google::protobuf::io::Printer::SourceLocation>
::
CoreImpl<google::protobuf::compiler::cpp::(anonymous_namespace)::AccessorVerifier&,google::protobuf::compiler::cpp::(anonymous_namespace)::AccessorVerifier>
          (CoreImpl<false,void,std::basic_string_view<char,std::char_traits<char>>,google::protobuf::io::Printer::SourceLocation>
           *this,AccessorVerifier *param_2)

{
  TargetType kTargetType;
  AccessorVerifier *f_local;
  CoreImpl<false,_void,_std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::io::Printer::SourceLocation>
  *this_local;
  
  Initialize<(absl::lts_20250127::internal_any_invocable::CoreImpl<false,void,std::basic_string_view<char,std::char_traits<char>>,google::protobuf::io::Printer::SourceLocation>::TargetType)3,google::protobuf::compiler::cpp::(anonymous_namespace)::AccessorVerifier&,google::protobuf::compiler::cpp::(anonymous_namespace)::AccessorVerifier,void>
            (this,param_2);
  return;
}

Assistant:

explicit CoreImpl(TypedConversionConstruct<QualDecayedTRef>, F&& f) {
    using DecayedT = RemoveCVRef<QualDecayedTRef>;

    constexpr TargetType kTargetType =
        (std::is_pointer<DecayedT>::value ||
         std::is_member_pointer<DecayedT>::value)
            ? TargetType::kPointer
        : IsCompatibleAnyInvocable<DecayedT>::value
            ? TargetType::kCompatibleAnyInvocable
        : IsAnyInvocable<DecayedT>::value
            ? TargetType::kIncompatibleAnyInvocable
            : TargetType::kOther;
    // NOTE: We only use integers instead of enums as template parameters in
    // order to work around a bug on C++14 under MSVC 2017.
    // See b/236131881.
    Initialize<kTargetType, QualDecayedTRef>(std::forward<F>(f));
  }